

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void google::protobuf::compiler::java::anon_unknown_0::CollectExtensions
               (FileDescriptorProto *file_proto,DescriptorPool *alternate_pool,
               FieldDescriptorSet *extensions,string *file_data)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Descriptor *type;
  LogMessage *pLVar4;
  Message *pMVar5;
  undefined4 extraout_var_00;
  MessageLite *this;
  LogFinisher local_91;
  scoped_ptr<google::protobuf::Message> dynamic_file_proto;
  LogMessage local_88;
  DynamicMessageFactory factory;
  
  bVar2 = CollectExtensions(&file_proto->super_Message,extensions);
  if (!bVar2) {
    iVar3 = (*(file_proto->super_Message).super_MessageLite._vptr_MessageLite[0x17])(file_proto);
    type = DescriptorPool::FindMessageTypeByName
                     (alternate_pool,*(string **)(CONCAT44(extraout_var,iVar3) + 8));
    if (type == (Descriptor *)0x0) {
      internal::LogMessage::LogMessage
                (&local_88,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x84);
      pLVar4 = internal::LogMessage::operator<<(&local_88,"CHECK failed: file_proto_desc: ");
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,"Find unknown fields in FileDescriptorProto when building ");
      pLVar4 = internal::LogMessage::operator<<(pLVar4,(file_proto->name_).ptr_);
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,
                          ". It\'s likely that those fields are custom options, however, descriptor.proto is not in the transitive dependencies. This normally should not happen. Please report a bug."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&factory,pLVar4);
      internal::LogMessage::~LogMessage(&local_88);
    }
    DynamicMessageFactory::DynamicMessageFactory(&factory);
    pMVar5 = DynamicMessageFactory::GetPrototype(&factory,type);
    iVar3 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])(pMVar5);
    dynamic_file_proto.ptr_ = (Message *)CONCAT44(extraout_var_00,iVar3);
    if (dynamic_file_proto.ptr_ == (Message *)0x0) {
      internal::LogMessage::LogMessage
                (&local_88,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x8d);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_88,"CHECK failed: dynamic_file_proto.get() != NULL: ");
      internal::LogFinisher::operator=(&local_91,pLVar4);
      internal::LogMessage::~LogMessage(&local_88);
    }
    this = &internal::scoped_ptr<google::protobuf::Message>::operator->(&dynamic_file_proto)->
            super_MessageLite;
    bVar2 = MessageLite::ParseFromString(this,file_data);
    if (!bVar2) {
      internal::LogMessage::LogMessage
                (&local_88,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x8e);
      file_data = (string *)
                  internal::LogMessage::operator<<
                            (&local_88,
                             "CHECK failed: dynamic_file_proto->ParseFromString(file_data): ");
      internal::LogFinisher::operator=(&local_91,(LogMessage *)file_data);
      internal::LogMessage::~LogMessage(&local_88);
    }
    std::
    _Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::_M_erase((_Rb_tree<const_google::protobuf::FieldDescriptor_*,_const_google::protobuf::FieldDescriptor_*,_std::_Identity<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)(extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent,
               (_Link_type)file_data);
    p_Var1 = &(extensions->_M_t)._M_impl.super__Rb_tree_header;
    (extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (extensions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (extensions->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    pMVar5 = internal::scoped_ptr<google::protobuf::Message>::operator*(&dynamic_file_proto);
    bVar2 = CollectExtensions(pMVar5,extensions);
    if (!bVar2) {
      internal::LogMessage::LogMessage
                (&local_88,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_file.cc"
                 ,0x94);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_88,
                          "CHECK failed: CollectExtensions(*dynamic_file_proto, extensions): ");
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,"Find unknown fields in FileDescriptorProto when building ");
      pLVar4 = internal::LogMessage::operator<<(pLVar4,(file_proto->name_).ptr_);
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,
                          ". It\'s likely that those fields are custom options, however, those options cannot be recognized in the builder pool. This normally should not happen. Please report a bug."
                         );
      internal::LogFinisher::operator=(&local_91,pLVar4);
      internal::LogMessage::~LogMessage(&local_88);
    }
    if (dynamic_file_proto.ptr_ != (Message *)0x0) {
      (*((dynamic_file_proto.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
    }
    DynamicMessageFactory::~DynamicMessageFactory(&factory);
  }
  return;
}

Assistant:

void CollectExtensions(const FileDescriptorProto& file_proto,
                       const DescriptorPool& alternate_pool,
                       FieldDescriptorSet* extensions,
                       const string& file_data) {
  if (!CollectExtensions(file_proto, extensions)) {
    // There are unknown fields in the file_proto, which are probably
    // extensions. We need to parse the data into a dynamic message based on the
    // builder-pool to find out all extensions.
    const Descriptor* file_proto_desc = alternate_pool.FindMessageTypeByName(
        file_proto.GetDescriptor()->full_name());
    GOOGLE_CHECK(file_proto_desc)
        << "Find unknown fields in FileDescriptorProto when building "
        << file_proto.name()
        << ". It's likely that those fields are custom options, however, "
           "descriptor.proto is not in the transitive dependencies. "
           "This normally should not happen. Please report a bug.";
    DynamicMessageFactory factory;
    google::protobuf::scoped_ptr<Message> dynamic_file_proto(
        factory.GetPrototype(file_proto_desc)->New());
    GOOGLE_CHECK(dynamic_file_proto.get() != NULL);
    GOOGLE_CHECK(dynamic_file_proto->ParseFromString(file_data));

    // Collect the extensions again from the dynamic message. There should be no
    // more unknown fields this time, i.e. all the custom options should be
    // parsed as extensions now.
    extensions->clear();
    GOOGLE_CHECK(CollectExtensions(*dynamic_file_proto, extensions))
        << "Find unknown fields in FileDescriptorProto when building "
        << file_proto.name()
        << ". It's likely that those fields are custom options, however, "
           "those options cannot be recognized in the builder pool. "
           "This normally should not happen. Please report a bug.";
  }
}